

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysp_node_free(lysf_ctx *ctx,lysp_node *node)

{
  ushort uVar1;
  lysp_qname *plVar2;
  char *pcVar3;
  long lVar4;
  lysp_node *plVar5;
  lysp_restr *plVar6;
  lysp_when *when;
  ulong uVar7;
  lysp_ext_instance *plVar8;
  lysp_ext_instance *plVar9;
  uint64_t c__;
  ulong uVar10;
  lysp_ext_instance *plVar11;
  lysp_node *plVar12;
  ly_ctx *ctx_00;
  uint64_t c___3;
  lysp_restr *restr;
  uint64_t c___2;
  long lVar13;
  
  plVar6 = lysp_node_musts(node);
  when = lysp_node_when(node);
  lydict_remove(ctx->ctx,node->name);
  lydict_remove(ctx->ctx,node->dsc);
  lydict_remove(ctx->ctx,node->ref);
  lVar13 = 0;
  uVar10 = 0;
  while( true ) {
    plVar2 = node->iffeatures;
    if (plVar2 == (lysp_qname *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ulong *)&plVar2[-1].flags;
    }
    if (uVar7 <= uVar10) break;
    if (plVar2 != (lysp_qname *)0x0) {
      lydict_remove(ctx->ctx,*(char **)((long)&plVar2->str + lVar13));
    }
    uVar10 = uVar10 + 1;
    lVar13 = lVar13 + 0x18;
  }
  if (plVar2 != (lysp_qname *)0x0) {
    free(&plVar2[-1].flags);
  }
  lVar13 = 0;
  plVar11 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar9 = node->exts;
    if (plVar9 == (lysp_ext_instance *)0x0) {
      plVar8 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar8 = plVar9[-1].exts;
    }
    if (plVar8 <= plVar11) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar9->name + lVar13));
    plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
    lVar13 = lVar13 + 0x70;
  }
  if (plVar9 != (lysp_ext_instance *)0x0) {
    free(&plVar9[-1].exts);
  }
  if (when != (lysp_when *)0x0) {
    lysp_when_free(ctx,when);
    free(when);
  }
  plVar11 = (lysp_ext_instance *)0x0;
  restr = plVar6;
  while( true ) {
    if (plVar6 == (lysp_restr *)0x0) {
      plVar9 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar9 = plVar6[-1].exts;
    }
    if (plVar9 <= plVar11) break;
    lysp_restr_free(ctx,restr);
    plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
    restr = restr + 1;
  }
  if (plVar6 != (lysp_restr *)0x0) {
    free(&plVar6[-1].exts);
  }
  uVar1 = node->nodetype;
  if (uVar1 < 0x100) {
    if (uVar1 < 0x10) {
      switch(uVar1) {
      case 1:
        lydict_remove(ctx->ctx,(char *)node[1].next);
        lVar13 = 0;
        uVar10 = 0;
        while( true ) {
          pcVar3 = node[1].name;
          if (pcVar3 == (char *)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = *(ulong *)(pcVar3 + -8);
          }
          if (uVar7 <= uVar10) break;
          lysp_tpdf_free(ctx,(lysp_tpdf *)(pcVar3 + lVar13));
          uVar10 = uVar10 + 1;
          lVar13 = lVar13 + 0xb0;
        }
        if (pcVar3 != (char *)0x0) {
          free(pcVar3 + -8);
        }
        plVar12 = (lysp_node *)node[1].dsc;
        if ((lysp_node *)node[1].dsc != (lysp_node *)0x0) {
          while (plVar12 != (lysp_node *)0x0) {
            plVar5 = plVar12->next;
            lysp_node_free(ctx,plVar12);
            plVar12 = plVar5;
          }
        }
        plVar12 = (lysp_node *)node[1].ref;
        while (plVar12 != (lysp_node *)0x0) {
          plVar5 = plVar12->next;
          lysp_node_free(ctx,plVar12);
          plVar12 = plVar5;
        }
        plVar12 = (lysp_node *)node[1].iffeatures;
        if ((lysp_node *)node[1].iffeatures != (lysp_node *)0x0) {
          while (plVar12 != (lysp_node *)0x0) {
            plVar5 = plVar12->next;
            lysp_node_free(ctx,plVar12);
            plVar12 = plVar5;
          }
        }
        plVar11 = node[1].exts;
        if (node[1].exts != (lysp_ext_instance *)0x0) {
          while (plVar11 != (lysp_ext_instance *)0x0) {
            plVar9 = *(lysp_ext_instance **)&plVar11->format;
            lysp_node_free(ctx,(lysp_node *)plVar11);
            plVar11 = plVar9;
          }
        }
        goto LAB_0015ecf0;
      case 2:
        plVar12 = node[1].parent;
        while (plVar12 != (lysp_node *)0x0) {
          plVar5 = plVar12->next;
          lysp_node_free(ctx,plVar12);
          plVar12 = plVar5;
        }
        ctx_00 = ctx->ctx;
        plVar12 = node[1].next;
        break;
      default:
        goto switchD_0015e5e2_caseD_3;
      case 4:
        lysp_type_free(ctx,(lysp_type *)&node[1].next);
        lydict_remove(ctx->ctx,(char *)node[2].exts);
        ctx_00 = ctx->ctx;
        plVar12 = node[3].parent;
        break;
      case 8:
        lysp_type_free(ctx,(lysp_type *)&node[1].next);
        lydict_remove(ctx->ctx,(char *)node[2].exts);
        lVar13 = 0;
        plVar11 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar12 = node[3].parent;
          if (plVar12 == (lysp_node *)0x0) {
            plVar9 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar9 = plVar12[-1].exts;
          }
          if (plVar9 <= plVar11) break;
          if (plVar12 != (lysp_node *)0x0) {
            lydict_remove(ctx->ctx,*(char **)((long)&plVar12->parent + lVar13));
          }
          plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
          lVar13 = lVar13 + 0x18;
        }
LAB_0015ecbb:
        if (plVar12 != (lysp_node *)0x0) {
          free(&plVar12[-1].exts);
        }
        goto LAB_0015ecf0;
      }
      lydict_remove(ctx_00,(char *)plVar12);
      goto LAB_0015ecf0;
    }
    if (uVar1 < 0x60) {
      if (uVar1 == 0x10) {
        lydict_remove(ctx->ctx,(char *)node[1].next);
        lVar13 = 0;
        uVar10 = 0;
        while( true ) {
          pcVar3 = node[1].name;
          if (pcVar3 == (char *)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = *(ulong *)(pcVar3 + -8);
          }
          if (uVar7 <= uVar10) break;
          lysp_tpdf_free(ctx,(lysp_tpdf *)(pcVar3 + lVar13));
          uVar10 = uVar10 + 1;
          lVar13 = lVar13 + 0xb0;
        }
        if (pcVar3 != (char *)0x0) {
          free(pcVar3 + -8);
        }
        plVar12 = (lysp_node *)node[1].dsc;
        if ((lysp_node *)node[1].dsc != (lysp_node *)0x0) {
          while (plVar12 != (lysp_node *)0x0) {
            plVar5 = plVar12->next;
            lysp_node_free(ctx,plVar12);
            plVar12 = plVar5;
          }
        }
        plVar12 = (lysp_node *)node[1].ref;
        while (plVar12 != (lysp_node *)0x0) {
          plVar5 = plVar12->next;
          lysp_node_free(ctx,plVar12);
          plVar12 = plVar5;
        }
        plVar12 = (lysp_node *)node[1].iffeatures;
        if ((lysp_node *)node[1].iffeatures != (lysp_node *)0x0) {
          while (plVar12 != (lysp_node *)0x0) {
            plVar5 = plVar12->next;
            lysp_node_free(ctx,plVar12);
            plVar12 = plVar5;
          }
        }
        plVar11 = node[1].exts;
        if (node[1].exts != (lysp_ext_instance *)0x0) {
          while (plVar11 != (lysp_ext_instance *)0x0) {
            plVar9 = *(lysp_ext_instance **)&plVar11->format;
            lysp_node_free(ctx,(lysp_node *)plVar11);
            plVar11 = plVar9;
          }
        }
        lVar13 = 0;
        plVar11 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar12 = node[2].parent;
          if (plVar12 == (lysp_node *)0x0) {
            plVar9 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar9 = plVar12[-1].exts;
          }
          if (plVar9 <= plVar11) break;
          if (plVar12 != (lysp_node *)0x0) {
            lydict_remove(ctx->ctx,*(char **)((long)&plVar12->parent + lVar13));
          }
          plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
          lVar13 = lVar13 + 0x18;
        }
        goto LAB_0015ecbb;
      }
      if (uVar1 == 0x20) goto LAB_0015ecf0;
    }
    else {
      if (uVar1 == 0x60) goto LAB_0015ecf0;
      if (uVar1 == 0x80) {
        plVar12 = node[1].parent;
        while (plVar12 != (lysp_node *)0x0) {
          plVar5 = plVar12->next;
          lysp_node_free(ctx,plVar12);
          plVar12 = plVar5;
        }
        goto LAB_0015ecf0;
      }
    }
  }
  else if (uVar1 < 0x1000) {
    if (uVar1 < 0x400) {
      if ((uVar1 == 0x100) || (uVar1 == 0x200)) {
        lVar13 = 0;
        plVar11 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar12 = node[1].parent;
          if (plVar12 == (lysp_node *)0x0) {
            plVar9 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar9 = plVar12[-1].exts;
          }
          if (plVar9 <= plVar11) break;
          lysp_tpdf_free(ctx,(lysp_tpdf *)((long)&plVar12->parent + lVar13));
          plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
          lVar13 = lVar13 + 0xb0;
        }
        if (plVar12 != (lysp_node *)0x0) {
          free(&plVar12[-1].exts);
        }
        plVar12 = *(lysp_node **)&node[1].nodetype;
        if (*(lysp_node **)&node[1].nodetype != (lysp_node *)0x0) {
          while (plVar12 != (lysp_node *)0x0) {
            plVar5 = plVar12->next;
            lysp_node_free(ctx,plVar12);
            plVar12 = plVar5;
          }
        }
        if (*(short *)&node[1].name != 0) {
          lysp_node_free(ctx,(lysp_node *)&node[1].next);
        }
        if (*(short *)&node[2].exts != 0) {
          lysp_node_free(ctx,(lysp_node *)&node[2].iffeatures);
        }
        goto LAB_0015ecf0;
      }
    }
    else {
      if (uVar1 == 0x400) {
        lVar13 = 0;
        uVar10 = 0;
        while( true ) {
          lVar4 = *(long *)&node[1].nodetype;
          if (lVar4 == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = *(ulong *)(lVar4 + -8);
          }
          if (uVar7 <= uVar10) break;
          lysp_tpdf_free(ctx,(lysp_tpdf *)(lVar4 + lVar13));
          uVar10 = uVar10 + 1;
          lVar13 = lVar13 + 0xb0;
        }
        if (lVar4 != 0) {
          free((void *)(lVar4 + -8));
        }
        plVar12 = node[1].next;
        if (node[1].next != (lysp_node *)0x0) {
          while (plVar12 != (lysp_node *)0x0) {
            plVar5 = plVar12->next;
            lysp_node_free(ctx,plVar12);
            plVar12 = plVar5;
          }
        }
        plVar12 = (lysp_node *)node[1].name;
        while (plVar12 != (lysp_node *)0x0) {
          plVar5 = plVar12->next;
          lysp_node_free(ctx,plVar12);
          plVar12 = plVar5;
        }
        goto LAB_0015ecf0;
      }
      if (uVar1 == 0x800) {
        lVar13 = 0;
        plVar11 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar12 = node[1].parent;
          if (plVar12 == (lysp_node *)0x0) {
            plVar9 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar9 = plVar12[-1].exts;
          }
          if (plVar9 <= plVar11) break;
          lysp_refine_free(ctx,(lysp_refine *)((long)&plVar12->parent + lVar13));
          plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
          lVar13 = lVar13 + 0x50;
        }
        if (plVar12 != (lysp_node *)0x0) {
          free(&plVar12[-1].exts);
        }
        plVar12 = *(lysp_node **)&node[1].nodetype;
        if (*(lysp_node **)&node[1].nodetype != (lysp_node *)0x0) {
          while (plVar12 != (lysp_node *)0x0) {
            plVar5 = plVar12->next;
            lysp_node_free(ctx,plVar12);
            plVar12 = plVar5;
          }
        }
        goto LAB_0015ecf0;
      }
    }
  }
  else if (uVar1 < 0x4000) {
    if ((uVar1 == 0x1000) || (uVar1 == 0x2000)) {
      lVar13 = 0;
      uVar10 = 0;
      while( true ) {
        lVar4 = *(long *)&node[1].nodetype;
        if (lVar4 == 0) {
          uVar7 = 0;
        }
        else {
          uVar7 = *(ulong *)(lVar4 + -8);
        }
        if (uVar7 <= uVar10) break;
        lysp_tpdf_free(ctx,(lysp_tpdf *)(lVar4 + lVar13));
        uVar10 = uVar10 + 1;
        lVar13 = lVar13 + 0xb0;
      }
      if (lVar4 != 0) {
        free((void *)(lVar4 + -8));
      }
      plVar12 = node[1].next;
      if (node[1].next != (lysp_node *)0x0) {
        while (plVar12 != (lysp_node *)0x0) {
          plVar5 = plVar12->next;
          lysp_node_free(ctx,plVar12);
          plVar12 = plVar5;
        }
      }
      plVar12 = (lysp_node *)node[1].name;
      while (plVar12 != (lysp_node *)0x0) {
        plVar5 = plVar12->next;
        lysp_node_free(ctx,plVar12);
        plVar12 = plVar5;
      }
      return;
    }
  }
  else {
    if (uVar1 == 0x8000) {
      plVar12 = node[1].parent;
      while (plVar12 != (lysp_node *)0x0) {
        plVar5 = plVar12->next;
        lysp_node_free(ctx,plVar12);
        plVar12 = plVar5;
      }
      plVar12 = node[1].next;
      while (plVar12 != (lysp_node *)0x0) {
        plVar5 = plVar12->next;
        lysp_node_free(ctx,plVar12);
        plVar12 = plVar5;
      }
      plVar12 = (lysp_node *)node[1].name;
      while (plVar12 != (lysp_node *)0x0) {
        plVar5 = plVar12->next;
        lysp_node_free(ctx,plVar12);
        plVar12 = plVar5;
      }
      goto LAB_0015ecf0;
    }
    if (uVar1 == 0x4000) {
      lVar13 = 0;
      plVar11 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar12 = node[1].parent;
        if (plVar12 == (lysp_node *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = plVar12[-1].exts;
        }
        if (plVar9 <= plVar11) break;
        lysp_tpdf_free(ctx,(lysp_tpdf *)((long)&plVar12->parent + lVar13));
        plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
        lVar13 = lVar13 + 0xb0;
      }
      if (plVar12 != (lysp_node *)0x0) {
        free(&plVar12[-1].exts);
      }
      plVar12 = *(lysp_node **)&node[1].nodetype;
      while (plVar12 != (lysp_node *)0x0) {
        plVar5 = plVar12->next;
        lysp_node_free(ctx,plVar12);
        plVar12 = plVar5;
      }
      plVar12 = node[1].next;
      while (plVar12 != (lysp_node *)0x0) {
        plVar5 = plVar12->next;
        lysp_node_free(ctx,plVar12);
        plVar12 = plVar5;
      }
      plVar12 = (lysp_node *)node[1].name;
      while (plVar12 != (lysp_node *)0x0) {
        plVar5 = plVar12->next;
        lysp_node_free(ctx,plVar12);
        plVar12 = plVar5;
      }
      plVar12 = (lysp_node *)node[1].dsc;
      while (plVar12 != (lysp_node *)0x0) {
        plVar5 = plVar12->next;
        lysp_node_free(ctx,plVar12);
        plVar12 = plVar5;
      }
      goto LAB_0015ecf0;
    }
  }
switchD_0015e5e2_caseD_3:
  ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
         ,0x25f);
LAB_0015ecf0:
  free(node);
  return;
}

Assistant:

void
lysp_node_free(struct lysf_ctx *ctx, struct lysp_node *node)
{
    struct lysp_node *child, *next;
    struct lysp_node_container *cont;
    struct lysp_node_leaf *leaf;
    struct lysp_node_leaflist *llist;
    struct lysp_node_list *list;
    struct lysp_node_choice *choice;
    struct lysp_node_case *cas;
    struct lysp_node_uses *uses;
    struct lysp_node_action *act;
    struct lysp_node_action_inout *inout;
    struct lysp_node_notif *notif;
    struct lysp_restr *musts = lysp_node_musts(node);
    struct lysp_when *when = lysp_node_when(node);

    lydict_remove(ctx->ctx, node->name);
    lydict_remove(ctx->ctx, node->dsc);
    lydict_remove(ctx->ctx, node->ref);
    FREE_ARRAY(ctx->ctx, node->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, node->exts, lysp_ext_instance_free);

    FREE_MEMBER(ctx, when, lysp_when_free);
    FREE_ARRAY(ctx, musts, lysp_restr_free);

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = (struct lysp_node_container *)node;

        lydict_remove(ctx->ctx, cont->presence);
        FREE_ARRAY(ctx, cont->typedefs, lysp_tpdf_free);
        if (cont->groupings) {
            LY_LIST_FOR_SAFE(&cont->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(cont->child, next, child) {
            lysp_node_free(ctx, child);
        }
        if (cont->actions) {
            LY_LIST_FOR_SAFE(&cont->actions->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (cont->notifs) {
            LY_LIST_FOR_SAFE(&cont->notifs->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        break;
    case LYS_LEAF:
        leaf = (struct lysp_node_leaf *)node;

        lysp_type_free(ctx, &leaf->type);
        lydict_remove(ctx->ctx, leaf->units);
        lydict_remove(ctx->ctx, leaf->dflt.str);
        break;
    case LYS_LEAFLIST:
        llist = (struct lysp_node_leaflist *)node;

        lysp_type_free(ctx, &llist->type);
        lydict_remove(ctx->ctx, llist->units);
        FREE_ARRAY(ctx->ctx, llist->dflts, lysp_qname_free);
        break;
    case LYS_LIST:
        list = (struct lysp_node_list *)node;

        lydict_remove(ctx->ctx, list->key);
        FREE_ARRAY(ctx, list->typedefs, lysp_tpdf_free);
        if (list->groupings) {
            LY_LIST_FOR_SAFE(&list->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(list->child, next, child) {
            lysp_node_free(ctx, child);
        }
        if (list->actions) {
            LY_LIST_FOR_SAFE(&list->actions->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (list->notifs) {
            LY_LIST_FOR_SAFE(&list->notifs->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        FREE_ARRAY(ctx->ctx, list->uniques, lysp_qname_free);
        break;
    case LYS_CHOICE:
        choice = (struct lysp_node_choice *)node;

        LY_LIST_FOR_SAFE(choice->child, next, child) {
            lysp_node_free(ctx, child);
        }
        lydict_remove(ctx->ctx, choice->dflt.str);
        break;
    case LYS_CASE:
        cas = (struct lysp_node_case *)node;

        LY_LIST_FOR_SAFE(cas->child, next, child) {
            lysp_node_free(ctx, child);
        }
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        /* nothing special to do */
        break;
    case LYS_USES:
        uses = (struct lysp_node_uses *)node;

        FREE_ARRAY(ctx, uses->refines, lysp_refine_free);
        if (uses->augments) {
            LY_LIST_FOR_SAFE(&uses->augments->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        act = (struct lysp_node_action *)node;

        FREE_ARRAY(ctx, act->typedefs, lysp_tpdf_free);
        if (act->groupings) {
            LY_LIST_FOR_SAFE(&act->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (act->input.nodetype) {
            lysp_node_free(ctx, &act->input.node);
        }
        if (act->output.nodetype) {
            lysp_node_free(ctx, &act->output.node);
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        inout = (struct lysp_node_action_inout *)node;

        FREE_ARRAY(ctx, inout->typedefs, lysp_tpdf_free);
        if (inout->groupings) {
            LY_LIST_FOR_SAFE(&inout->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(inout->child, next, child) {
            lysp_node_free(ctx, child);
        }
        /* do not free the node, it is never standalone but part of the action node */
        return;
    case LYS_NOTIF:
        notif = (struct lysp_node_notif *)node;

        FREE_ARRAY(ctx, notif->typedefs, lysp_tpdf_free);
        if (notif->groupings) {
            LY_LIST_FOR_SAFE(&notif->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(notif->child, next, child) {
            lysp_node_free(ctx, child);
        }
        break;
    case LYS_GROUPING:
        lysp_grp_free(ctx, (struct lysp_node_grp *)node);
        break;
    case LYS_AUGMENT:
        lysp_augment_free(ctx, ((struct lysp_node_augment *)node));
        break;
    default:
        LOGINT(ctx->ctx);
    }

    free(node);
}